

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

uint Assimp::StandardShapes::MakeOctahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  pointer *ppaVar1;
  iterator iVar2;
  aiVector3D v5;
  aiVector3D v4;
  aiVector3D v3;
  aiVector3D v2;
  aiVector3D v1;
  aiVector3D v0;
  aiVector3t<float> local_50;
  aiVector3t<float> local_44;
  aiVector3t<float> local_38;
  aiVector3t<float> local_2c;
  aiVector3t<float> local_20;
  aiVector3t<float> local_14;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 0x18);
  local_14.x = 1.0;
  local_14.y = 0.0;
  local_14.z = 0.0;
  local_20.x = -1.0;
  local_20.y = 0.0;
  local_20.z = 0.0;
  local_2c.x = 0.0;
  local_2c.y = 1.0;
  local_2c.z = 0.0;
  local_38.x = 0.0;
  local_38.y = -1.0;
  local_38.z = 0.0;
  local_44.x = 0.0;
  local_44.y = 0.0;
  local_44.z = 1.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = -1.0;
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_44);
  }
  else {
    (iVar2._M_current)->z = 1.0;
    (iVar2._M_current)->x = 0.0;
    (iVar2._M_current)->y = 0.0;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_14);
  }
  else {
    (iVar2._M_current)->z = local_14.z;
    (iVar2._M_current)->x = local_14.x;
    (iVar2._M_current)->y = local_14.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_2c);
  }
  else {
    (iVar2._M_current)->z = local_2c.z;
    (iVar2._M_current)->x = local_2c.x;
    (iVar2._M_current)->y = local_2c.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_44);
  }
  else {
    (iVar2._M_current)->z = local_44.z;
    (iVar2._M_current)->x = local_44.x;
    (iVar2._M_current)->y = local_44.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_2c);
  }
  else {
    (iVar2._M_current)->z = local_2c.z;
    (iVar2._M_current)->x = local_2c.x;
    (iVar2._M_current)->y = local_2c.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_44);
  }
  else {
    (iVar2._M_current)->z = local_44.z;
    (iVar2._M_current)->x = local_44.x;
    (iVar2._M_current)->y = local_44.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_38);
  }
  else {
    (iVar2._M_current)->z = local_38.z;
    (iVar2._M_current)->x = local_38.x;
    (iVar2._M_current)->y = local_38.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_44);
  }
  else {
    (iVar2._M_current)->z = local_44.z;
    (iVar2._M_current)->x = local_44.x;
    (iVar2._M_current)->y = local_44.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_38);
  }
  else {
    (iVar2._M_current)->z = local_38.z;
    (iVar2._M_current)->x = local_38.x;
    (iVar2._M_current)->y = local_38.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_14);
  }
  else {
    (iVar2._M_current)->z = local_14.z;
    (iVar2._M_current)->x = local_14.x;
    (iVar2._M_current)->y = local_14.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_2c);
  }
  else {
    (iVar2._M_current)->z = local_2c.z;
    (iVar2._M_current)->x = local_2c.x;
    (iVar2._M_current)->y = local_2c.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_14);
  }
  else {
    (iVar2._M_current)->z = local_14.z;
    (iVar2._M_current)->x = local_14.x;
    (iVar2._M_current)->y = local_14.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_2c);
  }
  else {
    (iVar2._M_current)->z = local_2c.z;
    (iVar2._M_current)->x = local_2c.x;
    (iVar2._M_current)->y = local_2c.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_38);
  }
  else {
    (iVar2._M_current)->z = local_38.z;
    (iVar2._M_current)->x = local_38.x;
    (iVar2._M_current)->y = local_38.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_14);
  }
  else {
    (iVar2._M_current)->z = local_14.z;
    (iVar2._M_current)->x = local_14.x;
    (iVar2._M_current)->y = local_14.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_38);
  }
  else {
    (iVar2._M_current)->z = local_38.z;
    (iVar2._M_current)->x = local_38.x;
    (iVar2._M_current)->y = local_38.y;
    ppaVar1 = &(positions->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeOctahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+24);

    const aiVector3D v0  = aiVector3D(1.0, 0.0, 0.0) ;
    const aiVector3D v1  = aiVector3D(-1.0, 0.0, 0.0);
    const aiVector3D v2  = aiVector3D(0.0, 1.0, 0.0);
    const aiVector3D v3  = aiVector3D(0.0, -1.0, 0.0);
    const aiVector3D v4  = aiVector3D(0.0, 0.0, 1.0);
    const aiVector3D v5  = aiVector3D(0.0, 0.0, -1.0);

    ADD_TRIANGLE(v4,v0,v2);
    ADD_TRIANGLE(v4,v2,v1);
    ADD_TRIANGLE(v4,v1,v3);
    ADD_TRIANGLE(v4,v3,v0);

    ADD_TRIANGLE(v5,v2,v0);
    ADD_TRIANGLE(v5,v1,v2);
    ADD_TRIANGLE(v5,v3,v1);
    ADD_TRIANGLE(v5,v0,v3);
    return 3;
}